

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O0

errr visuals_file_parser_finish(parser *parser)

{
  errr eVar1;
  visuals_parse_context *context_00;
  visuals_parse_context *context;
  parser *parser_local;
  
  context_00 = (visuals_parse_context *)parser_priv(parser);
  visuals_cycler_table = visuals_parse_context_convert(context_00);
  visuals_parse_context_free(context_00);
  parser_destroy(parser);
  eVar1 = 0;
  if (visuals_cycler_table == (visuals_cycler *)0x0) {
    eVar1 = 5;
  }
  return eVar1;
}

Assistant:

static errr visuals_file_parser_finish(struct parser *parser)
{
	struct visuals_parse_context *context = parser_priv(parser);
	visuals_cycler_table = visuals_parse_context_convert(context);
	visuals_parse_context_free(context);
	parser_destroy(parser);
	return (visuals_cycler_table == NULL) ? PARSE_ERROR_INTERNAL : PARSE_ERROR_NONE;
}